

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O3

void __thiscall Imf_2_5::SampleCountChannel::resize(SampleCountChannel *this)

{
  ulong __n;
  ulong uVar1;
  ImageLevel *pIVar2;
  uint *__s;
  uint *__s_00;
  size_t *__s_01;
  ulong uVar3;
  
  ImageChannel::resize(&this->super_ImageChannel);
  if (this->_numSamples != (uint *)0x0) {
    operator_delete__(this->_numSamples);
  }
  if (this->_sampleListSizes != (uint *)0x0) {
    operator_delete__(this->_sampleListSizes);
  }
  if (this->_sampleListPositions != (size_t *)0x0) {
    operator_delete__(this->_sampleListPositions);
  }
  this->_numSamples = (uint *)0x0;
  this->_sampleListSizes = (uint *)0x0;
  this->_sampleListPositions = (size_t *)0x0;
  uVar1 = (this->super_ImageChannel)._numPixels;
  __n = uVar1 * 4;
  uVar3 = -(ulong)(uVar1 >> 0x3e != 0) | __n;
  __s = (uint *)operator_new__(uVar3);
  this->_numSamples = __s;
  __s_00 = (uint *)operator_new__(uVar3);
  this->_sampleListSizes = __s_00;
  __s_01 = (size_t *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
  this->_sampleListPositions = __s_01;
  pIVar2 = (this->super_ImageChannel)._level;
  this->_base = __s + (-((long)(this->super_ImageChannel)._pixelsPerRow *
                        (long)(pIVar2->_dataWindow).min.y) - (long)(pIVar2->_dataWindow).min.x);
  if (uVar1 != 0) {
    memset(__s,0,__n);
    memset(__s_00,0,__n);
    memset(__s_01,0,uVar1 * 8);
  }
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  this->_sampleBufferSize = 0;
  return;
}

Assistant:

void
SampleCountChannel::resize ()
{
    ImageChannel::resize();

    delete [] _numSamples;
    delete [] _sampleListSizes;
    delete [] _sampleListPositions;

    _numSamples = 0;            // set to 0 to prevent double
    _sampleListSizes = 0;       // deletion in case of an exception
    _sampleListPositions = 0;

    _numSamples = new unsigned int [numPixels()];
    _sampleListSizes = new unsigned int [numPixels()];
    _sampleListPositions = new size_t [numPixels()];

    resetBasePointer();

    for (size_t i = 0; i < numPixels(); ++i)
    {
        _numSamples[i] = 0;
        _sampleListSizes[i] = 0;
        _sampleListPositions[i] = 0;
    }

    _totalNumSamples = 0;
    _totalSamplesOccupied = 0;

    _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);
}